

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O2

void transpose_32bit_4x4(__m128i *in,__m128i *out)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  longlong lVar9;
  longlong lVar10;
  longlong lVar11;
  longlong lVar12;
  longlong lVar13;
  longlong lVar14;
  longlong lVar15;
  
  uVar1 = *(undefined4 *)((long)*in + 4);
  lVar9 = (*in)[1];
  uVar2 = *(undefined4 *)((long)*in + 0xc);
  lVar10 = in[1][0];
  uVar3 = *(undefined4 *)((long)in[1] + 4);
  lVar11 = in[1][1];
  uVar4 = *(undefined4 *)((long)in[1] + 0xc);
  lVar12 = in[2][0];
  uVar5 = *(undefined4 *)((long)in[2] + 4);
  lVar13 = in[2][1];
  uVar6 = *(undefined4 *)((long)in[2] + 0xc);
  lVar14 = in[3][0];
  uVar7 = *(undefined4 *)((long)in[3] + 4);
  lVar15 = in[3][1];
  uVar8 = *(undefined4 *)((long)in[3] + 0xc);
  *(int *)*out = (int)(*in)[0];
  *(int *)((long)*out + 4) = (int)lVar10;
  *(int *)(*out + 1) = (int)lVar12;
  *(int *)((long)*out + 0xc) = (int)lVar14;
  *(undefined4 *)out[1] = uVar1;
  *(undefined4 *)((long)out[1] + 4) = uVar3;
  *(undefined4 *)(out[1] + 1) = uVar5;
  *(undefined4 *)((long)out[1] + 0xc) = uVar7;
  *(int *)out[2] = (int)lVar9;
  *(int *)((long)out[2] + 4) = (int)lVar11;
  *(int *)(out[2] + 1) = (int)lVar13;
  *(int *)((long)out[2] + 0xc) = (int)lVar15;
  *(undefined4 *)out[3] = uVar2;
  *(undefined4 *)((long)out[3] + 4) = uVar4;
  *(undefined4 *)(out[3] + 1) = uVar6;
  *(undefined4 *)((long)out[3] + 0xc) = uVar8;
  return;
}

Assistant:

static inline void transpose_32bit_4x4(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 32 bit elements. Goes from:
  // in[0]: 00 01 02 03
  // in[1]: 10 11 12 13
  // in[2]: 20 21 22 23
  // in[3]: 30 31 32 33
  // to:
  // a0:    00 10 01 11
  // a1:    20 30 21 31
  // a2:    02 12 03 13
  // a3:    22 32 23 33

  const __m128i a0 = _mm_unpacklo_epi32(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi32(in[2], in[3]);
  const __m128i a2 = _mm_unpackhi_epi32(in[0], in[1]);
  const __m128i a3 = _mm_unpackhi_epi32(in[2], in[3]);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30
  // out[1]: 01 11 21 31
  // out[2]: 02 12 22 32
  // out[3]: 03 13 23 33
  out[0] = _mm_unpacklo_epi64(a0, a1);
  out[1] = _mm_unpackhi_epi64(a0, a1);
  out[2] = _mm_unpacklo_epi64(a2, a3);
  out[3] = _mm_unpackhi_epi64(a2, a3);
}